

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Operations::Ambiguous
          (Operations *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1)

{
  _Base_ptr p_Var1;
  ostream *poVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  
  LoadProject(this,false);
  poVar2 = std::operator<<((ostream *)&std::cout,"Found ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," ambiguous includes\n\n");
  for (p_Var5 = (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->ambiguous)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Include for ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var5 + 1));
    std::operator<<(poVar2,"\nFound in : \n");
    p_Var1 = p_Var5[2]._M_parent;
    for (p_Var4 = *(_Base_ptr *)(p_Var5 + 2); p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  included from ");
      poVar2 = std::operator<<(poVar2,(string *)p_Var4);
      std::operator<<(poVar2,"\n");
    }
    std::operator<<((ostream *)&std::cout,"Options for file:\n");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->collisions,(key_type *)(p_Var5 + 1));
    for (p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
      std::operator<<(poVar2,"\n");
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return;
}

Assistant:

void Ambiguous(std::vector<std::string>) {
        LoadProject();
        std::cout << "Found " << ambiguous.size() << " ambiguous includes\n\n";
        for (auto &i : ambiguous) {
            std::cout << "Include for " << i.first << "\nFound in : \n";
            for (auto &s : i.second) {
                std::cout << "  included from " << s << "\n";
            }
            std::cout << "Options for file:\n";
            for (auto &c : collisions[i.first]) {
                std::cout << "  " << c << "\n";
            }
            std::cout << "\n";
        }
    }